

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O1

void __thiscall
pstd::
vector<pstd::optional<std::pair<int,_int>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_>_>
::vector(vector<pstd::optional<std::pair<int,_int>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_>_>
         *this,size_t count,polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_> *alloc)

{
  aligned_storage_t<sizeof(std::pair<int,_int>),_alignof(std::pair<int,_int>)> local_10;
  undefined4 local_8;
  
  local_8 = 0;
  local_10 = (aligned_storage_t<sizeof(std::pair<int,_int>),_alignof(std::pair<int,_int>)>)0x0;
  vector(this,count,(optional<std::pair<int,_int>_> *)&local_10.__align,alloc);
  return;
}

Assistant:

vector(size_t count, const Allocator &alloc = {}) : vector(count, T{}, alloc) {}